

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::FuncType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          *values,FuncType *out,char *desc)

{
  FuncType *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  int __c;
  Var *var_00;
  FuncType local_b8;
  Var local_80;
  char *local_38;
  char *desc_local;
  FuncType *out_local;
  vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
  *values_local;
  Var *var_local;
  SharedValidator *this_local;
  Result result;
  
  local_38 = desc;
  desc_local = (char *)out;
  out_local = (FuncType *)values;
  values_local = (vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                  *)var;
  var_local = (Var *)this;
  Var::Var(&local_80,var);
  sVar2 = std::
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          ::size((vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                  *)out_local);
  var_00 = &local_80;
  this_local._4_4_ = CheckIndex(this,var_00,(Index)sVar2,local_38);
  Var::~Var(&local_80);
  if (desc_local != (char *)0x0) {
    bVar1 = Succeeded(this_local._4_4_);
    this_00 = out_local;
    if (bVar1) {
      pcVar3 = Var::index(var,(char *)var_00,__c);
      pvVar4 = std::
               vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
               ::operator[]((vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                             *)this_00,(ulong)pcVar3 & 0xffffffff);
      FuncType::FuncType(&local_b8,pvVar4);
    }
    else {
      memset(&local_b8,0,0x38);
      FuncType::FuncType(&local_b8);
    }
    FuncType::operator=((FuncType *)desc_local,&local_b8);
    FuncType::~FuncType(&local_b8);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}